

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsCalibration.cpp
# Opt level: O2

void __thiscall
deqp::gls::TheilSenCalibrator::recordIteration(TheilSenCalibrator *this,deUint64 iterationTime)

{
  bool bVar1;
  deUint64 local_10;
  
  local_10 = iterationTime;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&(this->m_measureState).frameTimes,&local_10);
  if (this->m_state == INTERNALSTATE_RUNNING) {
    bVar1 = MeasureState::isDone(&this->m_measureState);
    if (bVar1) {
      this->m_state = INTERNALSTATE_FINISHED;
    }
  }
  return;
}

Assistant:

void TheilSenCalibrator::recordIteration (deUint64 iterationTime)
{
	DE_ASSERT((m_state == INTERNALSTATE_CALIBRATING || m_state == INTERNALSTATE_RUNNING) && !m_measureState.isDone());
	m_measureState.frameTimes.push_back(iterationTime);

	if (m_state == INTERNALSTATE_RUNNING && m_measureState.isDone())
		m_state = INTERNALSTATE_FINISHED;
}